

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readDistribution.hpp
# Opt level: O3

Distribution * __thiscall
njoy::ENDFtk::section::Type<26>::ReactionProduct::
readDistribution<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Distribution *__return_storage_ptr__,ReactionProduct *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int LAW,long lineLaw)

{
  undefined8 *puVar1;
  int MAT_00;
  undefined4 in_stack_0000001c;
  EnergyTransfer local_a8;
  
  MAT_00 = (int)lineNumber;
  if (MT == 8) {
    EnergyTransfer::EnergyTransfer<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (&local_a8,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    *(_Head_base<5UL,_long,_false> *)
     &(__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      ._M_u = local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
              super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     ._M_u + 8) =
         local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     ._M_u + 0x10) =
         local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Head_base<3UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                     ._M_u + 0x18) =
         local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
         _M_head_impl;
    *(double *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ._M_u + 0x20) =
         local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>
         ._M_head_impl;
    *(double *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ._M_u + 0x28) =
         local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Head_base<0UL,_double,_false>._M_head_impl;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ._M_u + 0x30) =
         local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ._M_u + 0x38) =
         local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ._M_u + 0x40) =
         local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ._M_u + 0x48) =
         local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ._M_u + 0x50) =
         local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ._M_u + 0x58) =
         local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ._M_u + 0x60) =
         local_a8.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ._M_u + 0x68) =
         local_a8.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ._M_u + 0x70) =
         local_a8.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ._M_u + 0x78) =
         local_a8.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ._M_u + 0x80) =
         local_a8.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
             ._M_u + 0x88) =
         local_a8.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
    ._M_index = '\x02';
  }
  else {
    if (MT == 2) {
      DiscreteTwoBodyScattering::
      DiscreteTwoBodyScattering<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((DiscreteTwoBodyScattering *)&local_a8,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,begin,(long *)end,MAT_00,MAT,MF);
      *(_Head_base<5UL,_long,_false> *)
       &(__return_storage_ptr__->
        super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
        ).
        super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
        .
        super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
        .
        super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
        .
        super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
        .
        super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
        ._M_u = local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.
                super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
      *(long *)((long)&(__return_storage_ptr__->
                       super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       ).
                       super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       ._M_u + 8) =
           local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
      *(long *)((long)&(__return_storage_ptr__->
                       super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       ).
                       super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       ._M_u + 0x10) =
           local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Head_base<3UL,_long,_false>._M_head_impl;
      *(long *)((long)&(__return_storage_ptr__->
                       super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       ).
                       super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       ._M_u + 0x18) =
           local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
           _M_head_impl;
      *(double *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x20) =
           local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Head_base<1UL,_double,_false>._M_head_impl;
      *(double *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x28) =
           local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Head_base<0UL,_double,_false>._M_head_impl;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x30) =
           local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x38) =
           local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
      ;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x40) =
           local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x48) =
           local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x50) =
           local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
      ;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x58) =
           local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x60) =
           local_a8.super_TabulationRecord.xValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x68) =
           local_a8.super_TabulationRecord.xValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x70) =
           local_a8.super_TabulationRecord.xValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_a8.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      ._M_index = '\x01';
      std::
      vector<njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering::TabulatedDistribution>_>
      ::~vector((vector<njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering::TabulatedDistribution>_>
                 *)&local_a8.super_TabulationRecord.xValues);
    }
    else {
      if (MT != 1) {
        tools::Log::error<char_const*>("Encountered illegal LAW value");
        tools::Log::info<char_const*>("LAW is equal to 1, 2 or 8");
        tools::Log::info<char_const*,int>("LAW value: {}",MT);
        tools::Log::info<char_const*,long>("Line number: {}",CONCAT44(in_stack_0000001c,LAW) + -1);
        puVar1 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar1 = getenv;
        __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
      }
      ContinuumEnergyAngle::
      ContinuumEnergyAngle<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((ContinuumEnergyAngle *)&local_a8,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,begin,(long *)end,MAT_00,MAT,MF);
      *(_Head_base<5UL,_long,_false> *)
       &(__return_storage_ptr__->
        super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
        ).
        super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
        .
        super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
        .
        super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
        .
        super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
        .
        super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
        ._M_u = local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.
                super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
      *(long *)((long)&(__return_storage_ptr__->
                       super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       ).
                       super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       ._M_u + 8) =
           local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
      *(long *)((long)&(__return_storage_ptr__->
                       super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       ).
                       super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       ._M_u + 0x10) =
           local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Head_base<3UL,_long,_false>._M_head_impl;
      *(long *)((long)&(__return_storage_ptr__->
                       super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       ).
                       super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       .
                       super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
                       ._M_u + 0x18) =
           local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
           _M_head_impl;
      *(double *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x20) =
           local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Head_base<1UL,_double,_false>._M_head_impl;
      *(double *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x28) =
           local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Head_base<0UL,_double,_false>._M_head_impl;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x30) =
           local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x38) =
           local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
      ;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x40) =
           local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x48) =
           local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x50) =
           local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
      ;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x58) =
           local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x60) =
           local_a8.super_TabulationRecord.xValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x68) =
           local_a8.super_TabulationRecord.xValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
               ._M_u + 0x70) =
           local_a8.super_TabulationRecord.xValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_a8.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<26>::EnergyTransfer>
      ._M_index = '\0';
      std::
      vector<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>
      ::~vector((vector<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>
                 *)&local_a8.super_TabulationRecord.xValues);
    }
    if (local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(local_a8.super_TabulationRecord.super_InterpolationBase.
                      interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.super_TabulationRecord.super_InterpolationBase.
                            interpolationSchemeIndices.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super_TabulationRecord.super_InterpolationBase.
                            interpolationSchemeIndices.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static Distribution
readDistribution( Iterator& begin,
                  const Iterator& end,
                  long& lineNumber,
                  int MAT,
                  int MF,
                  int MT,
                  int LAW,
                  long lineLaw ) {
  switch ( LAW ) {
    case   1 : return ContinuumEnergyAngle(
                        begin, end, lineNumber, MAT, MF, MT );
    case   2 : return DiscreteTwoBodyScattering(
                        begin, end, lineNumber, MAT, MF, MT );
    case   8 : return EnergyTransfer( begin, end, lineNumber, MAT, MF, MT );
    default : {
      Log::error( "Encountered illegal LAW value" );
      Log::info( "LAW is equal to 1, 2 or 8" );
      Log::info( "LAW value: {}", LAW );
      Log::info( "Line number: {}", lineLaw - 1 );
      throw std::exception();
    }
  }
}